

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

int __thiscall
section_data::pull_used_layers
          (section_data *this,vector<int,_std::allocator<int>_> *destination_vector)

{
  undefined8 in_RAX;
  _Base_ptr p_Var1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (p_Var1 = (this->polygons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->polygons)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    uStack_28 = CONCAT44(p_Var1[1]._M_color,(undefined4)uStack_28);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (destination_vector,(int *)((long)&uStack_28 + 4));
  }
  return 0;
}

Assistant:

int section_data::pull_used_layers(vector<int> &destination_vector)
{
  for (auto it = polygons.begin(); it != polygons.end(); ++it) {
    destination_vector.push_back(it->first);
  }
  return EXIT_SUCCESS;
}